

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ticket.c
# Opt level: O0

int ssl_ticket_gen_key(mbedtls_ssl_ticket_context *ctx,uchar index)

{
  int key_bitlen;
  mbedtls_ssl_ticket_key *pmVar1;
  time_t tVar2;
  mbedtls_ssl_ticket_key *key;
  uchar buf [32];
  int ret;
  uchar index_local;
  mbedtls_ssl_ticket_context *ctx_local;
  
  pmVar1 = ctx->keys + (int)(uint)index;
  tVar2 = time((time_t *)0x0);
  pmVar1->generation_time = (uint32_t)tVar2;
  ctx_local._4_4_ = (*ctx->f_rng)(ctx->p_rng,pmVar1->name,4);
  if ((ctx_local._4_4_ == 0) &&
     (ctx_local._4_4_ = (*ctx->f_rng)(ctx->p_rng,(uchar *)&key,0x20), ctx_local._4_4_ == 0)) {
    key_bitlen = mbedtls_cipher_get_key_bitlen(&pmVar1->ctx);
    ctx_local._4_4_ = mbedtls_cipher_setkey(&pmVar1->ctx,(uchar *)&key,key_bitlen,MBEDTLS_ENCRYPT);
    mbedtls_zeroize(&key,0x20);
  }
  return ctx_local._4_4_;
}

Assistant:

static int ssl_ticket_gen_key( mbedtls_ssl_ticket_context *ctx,
                               unsigned char index )
{
    int ret;
    unsigned char buf[MAX_KEY_BYTES];
    mbedtls_ssl_ticket_key *key = ctx->keys + index;

#if defined(MBEDTLS_HAVE_TIME)
    key->generation_time = (uint32_t) mbedtls_time( NULL );
#endif

    if( ( ret = ctx->f_rng( ctx->p_rng, key->name, sizeof( key->name ) ) ) != 0 )
        return( ret );

    if( ( ret = ctx->f_rng( ctx->p_rng, buf, sizeof( buf ) ) ) != 0 )
        return( ret );

    /* With GCM and CCM, same context can encrypt & decrypt */
    ret = mbedtls_cipher_setkey( &key->ctx, buf,
                                 mbedtls_cipher_get_key_bitlen( &key->ctx ),
                                 MBEDTLS_ENCRYPT );

    mbedtls_zeroize( buf, sizeof( buf ) );

    return( ret );
}